

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O2

int archive_write_client_free(archive_write_filter *f)

{
  archive *paVar1;
  code *pcVar2;
  char *__s;
  size_t __n;
  
  paVar1 = f->archive;
  pcVar2 = (code *)paVar1[1].error_string.buffer_length;
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(paVar1);
  }
  paVar1[1].current_code = (char *)0x0;
  __s = *(char **)&paVar1[2].file_count;
  if (__s != (char *)0x0) {
    __n = strlen(__s);
    memset(__s,0,__n);
    free(*(void **)&paVar1[2].file_count);
    paVar1[2].file_count = 0;
    paVar1[2].archive_error_number = 0;
  }
  return 0;
}

Assistant:

static int
archive_write_client_free(struct archive_write_filter *f)
{
	struct archive_write *a = (struct archive_write *)f->archive;

	if (a->client_freer)
		(*a->client_freer)(&a->archive, a->client_data);
	a->client_data = NULL;

	/* Clear passphrase. */
	if (a->passphrase != NULL) {
		memset(a->passphrase, 0, strlen(a->passphrase));
		free(a->passphrase);
		a->passphrase = NULL;
	}

	return (ARCHIVE_OK);
}